

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall Config::Config(Config *this,int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  char *__s1;
  int iVar2;
  string *key;
  string *val;
  allocator local_2a1;
  Config *local_2a0;
  int option_index;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190 [32];
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var1 = &(this->config_)._M_t._M_impl.super__Rb_tree_header;
  (this->config_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->config_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->config_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->config_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->config_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  option_index = 0;
  local_2a0 = this;
LAB_001161f0:
  iVar2 = getopt_long(argc,argv,"p:l:s:b:",Config::long_options,&option_index);
  if (iVar2 == 1) {
    __s1 = Config::long_options[option_index].name;
    iVar2 = strcmp(__s1,"server-port");
    if (iVar2 == 0) {
      std::__cxx11::string::string((string *)&local_230,"server_port",(allocator *)local_190);
      std::__cxx11::string::string((string *)&local_d0,_optarg,&local_2a1);
      SetStr(local_2a0,&local_230,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_230);
      goto LAB_001161f0;
    }
    iVar2 = strcmp(__s1,"local-port");
    if (iVar2 == 0) {
      std::__cxx11::string::string((string *)&local_250,"local_port",(allocator *)local_190);
      std::__cxx11::string::string((string *)&local_f0,_optarg,&local_2a1);
      SetStr(local_2a0,&local_250,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_250);
      goto LAB_001161f0;
    }
    iVar2 = strcmp(__s1,"server-address");
    if (iVar2 != 0) {
      iVar2 = strcmp(__s1,"local-address");
      if (iVar2 == 0) {
        std::__cxx11::string::string((string *)&local_290,"local_address",(allocator *)local_190);
        val = &local_130;
        std::__cxx11::string::string((string *)val,_optarg,&local_2a1);
        key = &local_290;
        SetStr(local_2a0,key,val);
        goto LAB_001164b5;
      }
      iVar2 = strcmp(__s1,"server");
      if (iVar2 == 0) {
        key = &local_150;
        std::__cxx11::string::string((string *)key,"is_local",(allocator *)local_190);
        SetInt(local_2a0,key,0);
      }
      else {
        iVar2 = strcmp(__s1,"client");
        if (iVar2 != 0) goto LAB_001161f0;
        key = &local_170;
        std::__cxx11::string::string((string *)key,"is_local",(allocator *)local_190);
        SetInt(local_2a0,key,1);
      }
      goto LAB_001164bd;
    }
    std::__cxx11::string::string((string *)&local_270,"server_address",(allocator *)local_190);
    val = &local_110;
    std::__cxx11::string::string((string *)val,_optarg,&local_2a1);
    key = &local_270;
    SetStr(local_2a0,key,val);
  }
  else if (iVar2 == 0x62) {
    std::__cxx11::string::string((string *)&local_210,"local_address",(allocator *)local_190);
    val = &local_b0;
    std::__cxx11::string::string((string *)val,_optarg,&local_2a1);
    key = &local_210;
    SetStr(local_2a0,key,val);
  }
  else if (iVar2 == 0x6c) {
    std::__cxx11::string::string((string *)&local_1d0,"local_port",(allocator *)local_190);
    val = &local_70;
    std::__cxx11::string::string((string *)val,_optarg,&local_2a1);
    key = &local_1d0;
    SetStr(local_2a0,key,val);
  }
  else {
    if (iVar2 != 0x70) {
      if (iVar2 == 0x73) {
        std::__cxx11::string::string((string *)&local_1f0,"server_address",(allocator *)local_190);
        val = &local_90;
        std::__cxx11::string::string((string *)val,_optarg,&local_2a1);
        key = &local_1f0;
        SetStr(local_2a0,key,val);
        goto LAB_001164b5;
      }
      if (iVar2 == -1) {
        return;
      }
      Log::GetInstance();
      Log::FormatTime_abi_cxx11_();
      std::operator<<((ostream *)&std::cout,local_190);
      std::operator<<((ostream *)&std::cout," [warning] ");
      std::operator<<((ostream *)&std::cout,"unknown option <");
      std::operator<<((ostream *)&std::cout,(char)iVar2);
      std::operator<<((ostream *)&std::cout,">");
      std::__cxx11::string::~string(local_190);
      goto LAB_001161f0;
    }
    std::__cxx11::string::string((string *)&local_1b0,"server_port",(allocator *)local_190);
    val = &local_50;
    std::__cxx11::string::string((string *)val,_optarg,&local_2a1);
    key = &local_1b0;
    SetStr(local_2a0,key,val);
  }
LAB_001164b5:
  std::__cxx11::string::~string((string *)val);
LAB_001164bd:
  std::__cxx11::string::~string((string *)key);
  goto LAB_001161f0;
}

Assistant:

Config::Config(int argc, char *argv[])
{
    int opt;
    static struct option long_options[] =
    {
        { "server-port", required_argument,    0, 1 },
        { "local-port", required_argument,    0, 1 },
        { "server-address", required_argument,    0, 1 },
        { "local-address", required_argument,    0, 1 },
        { "server", no_argument,    0, 1 },
        { "client", no_argument,    0, 1 },
        { NULL, 0, 0, 0 }
    };
    int option_index = 0;

    while ((opt = getopt_long(argc, argv, "p:l:s:b:", long_options, &option_index)) != -1)
    {
        switch (opt)
        {
        case 'p':
            this->SetStr("server_port", optarg);
            break;
        case 'l':
            this->SetStr("local_port", optarg);
            break;
        case 's':
            this->SetStr("server_address", optarg);
            break;
        case 'b':
            this->SetStr("local_address", optarg);
            break;
        case 1:
            if (strcmp(long_options[option_index].name, "server-port") == 0)
            {
                this->SetStr("server_port", optarg);
            }
            else if (strcmp(long_options[option_index].name, "local-port") == 0)
            {
                this->SetStr("local_port", optarg);
            }
            else if (strcmp(long_options[option_index].name, "server-address") == 0)
            {
                this->SetStr("server_address", optarg);
            }
            else if (strcmp(long_options[option_index].name, "local-address") == 0)
            {
                this->SetStr("local_address", optarg);
            }
            else if (strcmp(long_options[option_index].name, "server") == 0)
            {
                this->SetInt("is_local", 0);
            }
            else if (strcmp(long_options[option_index].name, "client") == 0)
            {
                this->SetInt("is_local", 1);
            }
            break;
        default:
            LOGW << "unknown option <" << (char)opt << ">";
        }
    }
}